

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O2

iterator __thiscall
nestl::impl::detail::
rb_tree<int,int,nestl::impl::detail::identity<int>,std::less<int>,nestl::test::minimal_allocator<int>>
::m_insert_<nestl::has_exceptions::exception_ptr_error,int>
          (rb_tree<int,int,nestl::impl::detail::identity<int>,std::less<int>,nestl::test::minimal_allocator<int>>
           *this,exception_ptr_error *err,base_ptr x,base_ptr p,int *v)

{
  bool bVar1;
  link_type x_00;
  bool insert_left;
  link_type header;
  
  header = (link_type)(this + 8);
  insert_left = true;
  if (header != (link_type)p && x == (base_ptr)0x0) {
    insert_left = *v < (int)p[1].m_color;
  }
  x_00 = m_create_node<nestl::has_exceptions::exception_ptr_error,int>(this,err,v);
  bVar1 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
  if (!bVar1) {
    rb_tree_insert_and_rebalance
              (insert_left,&x_00->super_rb_tree_node_base,p,(rb_tree_node_base *)header);
    *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
    header = x_00;
  }
  return (iterator)&header->super_rb_tree_node_base;
}

Assistant:

typename rb_tree<Key, Val, KeyOfValue, Compare, Alloc>::iterator
rb_tree<Key, Val, KeyOfValue, Compare, Alloc>::m_insert_(OperationError& err, base_ptr x, base_ptr p, Arg&& v) NESTL_NOEXCEPT_SPEC
{
    bool insert_left = (x != 0 || p == m_end()
                        || m_impl.m_key_compare(KeyOfValue()(v), s_key(p)));

    link_type l = m_create_node(err, std::forward<Arg>(v));
    if (err)
    {
        return end();
    }

    rb_tree_insert_and_rebalance(insert_left, l, p, this->m_impl.m_header);
    ++m_impl.m_node_count;
    return iterator(l);
}